

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rrRenderState.hpp
# Opt level: O0

void __thiscall
rr::RenderState::RenderState
          (RenderState *this,ViewportState *viewport_,ViewportOrientation viewportOrientation_)

{
  int iVar1;
  float fVar2;
  ViewportOrientation viewportOrientation__local;
  ViewportState *viewport__local;
  RenderState *this_local;
  
  this->cullMode = CULLMODE_NONE;
  this->provokingVertexConvention = PROVOKINGVERTEX_LAST;
  RasterizationState::RasterizationState(&this->rasterization);
  FragmentOperationState::FragmentOperationState(&this->fragOps);
  PointState::PointState(&this->point);
  iVar1 = (viewport_->rect).bottom;
  (this->viewport).rect.left = (viewport_->rect).left;
  (this->viewport).rect.bottom = iVar1;
  iVar1 = (viewport_->rect).height;
  (this->viewport).rect.width = (viewport_->rect).width;
  (this->viewport).rect.height = iVar1;
  fVar2 = viewport_->zf;
  (this->viewport).zn = viewport_->zn;
  (this->viewport).zf = fVar2;
  LineState::LineState(&this->line);
  RestartState::RestartState(&this->restart);
  this->viewportOrientation = viewportOrientation_;
  (this->rasterization).viewportOrientation = this->viewportOrientation;
  return;
}

Assistant:

explicit RenderState (const ViewportState& viewport_, ViewportOrientation viewportOrientation_ = VIEWPORTORIENTATION_LOWER_LEFT)
		: cullMode					(CULLMODE_NONE)
		, provokingVertexConvention	(PROVOKINGVERTEX_LAST)
		, viewport					(viewport_)
		, viewportOrientation		(viewportOrientation_)
	{
		rasterization.viewportOrientation = viewportOrientation;
	}